

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_direction_node.cpp
# Opt level: O1

void __thiscall random_direction_node::reflect(random_direction_node *this,int err)

{
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar1;
  
  if ((this->super_node).lastErr != err) {
    switch(err) {
    case 1:
      do {
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        (this->super_node).d = dVar1 * 6.283185307179586 + 0.0;
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        (this->super_node).p = dVar1 * 3.141592653589793 + 0.0;
        dVar1 = (this->super_node).d;
        if (dVar1 < 1.5707963267948966) break;
      } while (dVar1 <= 4.71238898038469);
      break;
    case 2:
      do {
        do {
          dVar1 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (&e);
          (this->super_node).d = dVar1 * 6.283185307179586 + 0.0;
          dVar1 = std::
                  generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                            (&e);
          (this->super_node).p = dVar1 * 3.141592653589793 + 0.0;
          dVar1 = (this->super_node).d;
        } while (dVar1 <= 1.5707963267948966);
      } while (4.71238898038469 <= dVar1);
      break;
    case 3:
      do {
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        (this->super_node).d = dVar1 * 6.283185307179586 + 0.0;
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        (this->super_node).p = dVar1 * 3.141592653589793 + 0.0;
      } while (3.141592653589793 <= (this->super_node).d);
      break;
    case 4:
      do {
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        (this->super_node).d = dVar1 * 6.283185307179586 + 0.0;
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        (this->super_node).p = dVar1 * 3.141592653589793 + 0.0;
      } while ((this->super_node).d <= 3.141592653589793);
      break;
    case 5:
      do {
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        (this->super_node).d = dVar1 * 6.283185307179586 + 0.0;
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        dVar1 = dVar1 * 3.141592653589793 + 0.0;
        (this->super_node).p = dVar1;
      } while (1.5707963267948966 <= dVar1);
      break;
    case 6:
      do {
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        (this->super_node).d = dVar1 * 6.283185307179586 + 0.0;
        dVar1 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                          (&e);
        dVar1 = dVar1 * 3.141592653589793 + 0.0;
        (this->super_node).p = dVar1;
      } while (dVar1 <= 1.5707963267948966);
    }
    (this->super_node).lastErr = err;
    (this->super_node).field_0x39 = 1;
  }
  return;
}

Assistant:

void random_direction_node::reflect(int err){      //err: 1 XMIN 2 XMAX 3 YMIN 4 YMAX
    uniform_real_distribution<double> randomDir(0,2*M_PI);
    uniform_real_distribution<double> randomPitch(0,M_PI);
    if (err == lastErr) {           //In case random_direction_node reflect forever near an edge
        return;
    }
    if(err == 1){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(d >= M_PI/2 && d <= 3*M_PI/2);
    }else if(err == 2){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(d <= M_PI/2 || d >= 3*M_PI/2);
    }else if(err == 3){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(d >= M_PI);
    }else if(err == 4){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(d <= M_PI);
    }else if(err == 5){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(p >= 0.5*M_PI);
    }else if(err == 6){
        do{
            d = randomDir(e);
            p = randomPitch(e);
        }while(p <= 0.5*M_PI);
    }
    lastErr = err;
    reflected = true;
}